

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgroup_controller.cpp
# Opt level: O2

void __thiscall CgroupController::enter(CgroupController *this)

{
  __pid_t __val;
  ContextManager *pCVar1;
  ssize_t sVar2;
  string to_write;
  string local_50;
  string local_30;
  
  if (this->enter_fd_ == -1) {
    pCVar1 = ContextManager::get();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"Cgroup enter was not delayed",(allocator<char> *)&local_30);
    (**pCVar1->_vptr_ContextManager)(pCVar1,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  __val = getpid();
  std::__cxx11::to_string(&local_50,__val);
  sVar2 = ::write(this->enter_fd_,local_50._M_dataplus._M_p,local_50._M_string_length);
  if (((int)(uint)sVar2 < 0) || (((uint)sVar2 & 0x7fffffff) != local_50._M_string_length)) {
    pCVar1 = ContextManager::get();
    format_abi_cxx11_(&local_30,"Cannot write to cgroups tasks file: %m");
    (**pCVar1->_vptr_ContextManager)(pCVar1,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  close_enter_fd(this);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void CgroupController::enter() {
    if (enter_fd_ == -1) {
        die("Cgroup enter was not delayed");
    }
    std::string to_write = std::to_string(getpid());
    int cnt = ::write(enter_fd_, to_write.c_str(), to_write.size());
    if (cnt < 0 || static_cast<size_t>(cnt) != to_write.size()) {
        die(format("Cannot write to cgroups tasks file: %m"));
    }
    close_enter_fd();
}